

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmBcc<(moira::Instr)23,(moira::Mode)12,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  UInt u;
  Syntax SVar1;
  StrWriter *pSVar2;
  Av<(moira::Instr)23,_(moira::Mode)12,_1> *av;
  Av<(moira::Instr)23,_(moira::Mode)12,_1> local_20;
  Av<(moira::Instr)23,_(moira::Mode)12,_1> local_1c;
  
  u.raw = (char)op + 2 + *addr;
  SVar1 = str->style->syntax;
  if (SVar1 - GNU < 2) {
    pSVar2 = StrWriter::operator<<(str);
    pSVar2 = StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
    StrWriter::operator<<(pSVar2,u);
    return;
  }
  if (SVar1 == MUSASHI) {
    if ((char)op == -1) {
      dasmIllegal<(moira::Instr)23,(moira::Mode)12,1>(this,str,addr,op);
      return;
    }
    pSVar2 = StrWriter::operator<<(str);
    StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
    StrWriter::operator<<(pSVar2,u);
    av = &local_1c;
  }
  else {
    pSVar2 = StrWriter::operator<<(str);
    StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
    StrWriter::operator<<(pSVar2,u);
    av = &local_20;
  }
  av->ext1 = 0;
  StrWriter::operator<<(pSVar2,av);
  return;
}

Assistant:

void
Moira::dasmBcc(StrWriter &str, u32 &addr, u16 op) const
{
    u32 dst = addr;
    U32_INC(dst, 2);
    U32_INC(dst, S == Byte ? (i8)op : SEXT<S>(dasmIncRead<S>(addr)));

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            if (S == Byte && (u8)op == 0xFF) {

                dasmIllegal<I, M, S>(str, addr, op);
                break;
            }

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Szb<S>{} << str.tab << UInt(dst);
            break;

        default:

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;
    }
}